

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

CURLcode Curl_read(connectdata *conn,curl_socket_t sockfd,char *buf,size_t sizerequested,ssize_t *n)

{
  int iVar1;
  size_t sVar2;
  _Bool _Var3;
  size_t __n;
  size_t sVar4;
  char *pcVar5;
  ulong __n_00;
  bool bVar6;
  CURLcode result;
  CURLcode local_40;
  curl_socket_t local_3c;
  size_t *local_38;
  
  local_40 = CURLE_RECV_ERROR;
  _Var3 = Curl_pipeline_wanted(conn->data->multi,1);
  iVar1 = conn->sock[1];
  bVar6 = iVar1 == sockfd;
  *n = 0;
  local_38 = (size_t *)n;
  if (_Var3) {
    __n_00 = conn->buf_len - conn->read_pos;
    if (sizerequested <= __n_00) {
      __n_00 = sizerequested;
    }
    if (__n_00 == 0) {
      sVar4 = 0x4000;
      if (sizerequested < 0x4000) {
        sVar4 = sizerequested;
      }
      pcVar5 = conn->master_buffer;
    }
    else {
      local_3c = sockfd;
      memcpy(buf,conn->master_buffer + conn->read_pos,__n_00);
      conn->read_pos = conn->read_pos + __n_00;
      (conn->bits).stream_was_rewound = false;
      *local_38 = __n_00;
      pcVar5 = (char *)0x0;
      sVar4 = 0;
      sockfd = local_3c;
    }
    if (__n_00 != 0) {
      return CURLE_OK;
    }
  }
  else {
    sVar2 = (conn->data->set).buffer_size;
    sVar4 = 0x4000;
    if (sVar2 != 0) {
      sVar4 = sVar2;
    }
    pcVar5 = buf;
    if ((long)sizerequested <= (long)sVar4) {
      sVar4 = sizerequested;
    }
  }
  __n = (*conn->recv[iVar1 == sockfd])(conn,SUB14(bVar6,0),pcVar5,sVar4,&local_40);
  if (-1 < (long)__n) {
    if (_Var3) {
      memcpy(buf,conn->master_buffer,__n);
      conn->buf_len = __n;
      conn->read_pos = __n;
    }
    *local_38 = *local_38 + __n;
    local_40 = CURLE_OK;
  }
  return local_40;
}

Assistant:

CURLcode Curl_read(struct connectdata *conn, /* connection data */
                   curl_socket_t sockfd,     /* read from this socket */
                   char *buf,                /* store read data here */
                   size_t sizerequested,     /* max amount to read */
                   ssize_t *n)               /* amount bytes read */
{
  CURLcode result = CURLE_RECV_ERROR;
  ssize_t nread = 0;
  size_t bytesfromsocket = 0;
  char *buffertofill = NULL;
  bool pipelining = Curl_pipeline_wanted(conn->data->multi, CURLPIPE_HTTP1);

  /* Set 'num' to 0 or 1, depending on which socket that has been sent here.
     If it is the second socket, we set num to 1. Otherwise to 0. This lets
     us use the correct ssl handle. */
  int num = (sockfd == conn->sock[SECONDARYSOCKET]);

  *n=0; /* reset amount to zero */

  /* If session can pipeline, check connection buffer  */
  if(pipelining) {
    size_t bytestocopy = CURLMIN(conn->buf_len - conn->read_pos,
                                 sizerequested);

    /* Copy from our master buffer first if we have some unread data there*/
    if(bytestocopy > 0) {
      memcpy(buf, conn->master_buffer + conn->read_pos, bytestocopy);
      conn->read_pos += bytestocopy;
      conn->bits.stream_was_rewound = FALSE;

      *n = (ssize_t)bytestocopy;
      return CURLE_OK;
    }
    /* If we come here, it means that there is no data to read from the buffer,
     * so we read from the socket */
    bytesfromsocket = CURLMIN(sizerequested, BUFSIZE * sizeof (char));
    buffertofill = conn->master_buffer;
  }
  else {
    bytesfromsocket = CURLMIN((long)sizerequested,
                              conn->data->set.buffer_size ?
                              conn->data->set.buffer_size : BUFSIZE);
    buffertofill = buf;
  }

  nread = conn->recv[num](conn, num, buffertofill, bytesfromsocket, &result);
  if(nread < 0)
    return result;

  if(pipelining) {
    memcpy(buf, conn->master_buffer, nread);
    conn->buf_len = nread;
    conn->read_pos = nread;
  }

  *n += nread;

  return CURLE_OK;
}